

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

void __thiscall Assimp::B3DImporter::ReadBB3D(B3DImporter *this,aiScene *scene)

{
  float fVar1;
  value_type paVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *pvVar6;
  bool bVar7;
  uint uVar8;
  Logger *this_00;
  size_type sVar9;
  aiNode *paVar10;
  reference ppaVar11;
  reference this_01;
  pointer paVar12;
  ulong uVar13;
  ulong uVar14;
  reference pvVar15;
  reference this_02;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *pvVar16;
  aiVertexWeight *paVar17;
  aiMatrix4x4t<float> *__src;
  aiBone **ppaVar18;
  aiMaterial *this_03;
  aiMaterial **ppaVar19;
  aiMesh **ppaVar20;
  reference this_04;
  pointer paVar21;
  aiNodeAnim **ppaVar22;
  aiAnimation **ppaVar23;
  aiFace *local_378;
  aiVector3t<float> *local_350;
  aiVector3t<float> *local_328;
  undefined1 local_2c0 [8];
  FlipWindingOrderProcess flip;
  MakeLeftHandedProcess makeleft;
  aiAnimation *anim;
  aiMatrix4x4t<float> local_280;
  undefined1 local_240 [8];
  aiMatrix4x4 mat;
  aiNode *bnode;
  aiBone *bone_1;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *weights;
  size_t i_2;
  vector<aiBone_*,_std::allocator<aiBone_*>_> bones;
  float weight;
  int bone;
  int k;
  Vertex *v;
  int local_1a0;
  int j_1;
  int i_1;
  vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
  vweights;
  aiFace *face;
  aiVector3D *mc;
  aiVector3D *mn;
  aiVector3D *mv;
  int n_verts;
  int n_tris;
  aiMesh *mesh;
  size_t j;
  aiNode *node;
  size_t i;
  string local_130;
  allocator<char> local_109;
  string local_108;
  undefined1 local_e8 [8];
  string t_1;
  char dmp [128];
  int version;
  undefined1 local_38 [8];
  string t;
  aiScene *scene_local;
  B3DImporter *this_local;
  
  t.field_2._8_8_ = scene;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->_textures);
  std::
  vector<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
  ::clear(&this->_materials);
  std::vector<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>::clear
            (&this->_vertices);
  std::
  vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  ::clear(&this->_meshes);
  DeleteAllBarePointers<aiNode*>(&this->_nodes);
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::clear(&this->_nodes);
  std::
  vector<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
  ::clear(&this->_nodeAnims);
  std::
  vector<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
  ::clear(&this->_animations);
  ReadChunk_abi_cxx11_((string *)local_38,this);
  bVar7 = std::operator==((string *)local_38,"BB3D");
  if (bVar7) {
    uVar8 = ReadInt(this);
    bVar7 = DefaultLogger::isNullLogger();
    if (!bVar7) {
      snprintf(t_1.field_2._M_local_buf + 8,0x80,"B3D file format version: %i",(ulong)uVar8);
      this_00 = DefaultLogger::get();
      Logger::info(this_00,t_1.field_2._M_local_buf + 8);
    }
    while (uVar8 = ChunkSize(this), uVar8 != 0) {
      ReadChunk_abi_cxx11_((string *)local_e8,this);
      bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_e8,"TEXS");
      if (bVar7) {
        ReadTEXS(this);
      }
      else {
        bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_e8,"BRUS");
        if (bVar7) {
          ReadBRUS(this);
        }
        else {
          bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_e8,"NODE");
          if (bVar7) {
            ReadNODE(this,(aiNode *)0x0);
          }
        }
      }
      ExitChunk(this);
      std::__cxx11::string::~string((string *)local_e8);
    }
  }
  ExitChunk(this);
  sVar9 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size(&this->_nodes);
  if (sVar9 != 0) {
    sVar9 = std::
            vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
            ::size(&this->_meshes);
    if (sVar9 != 0) {
      for (node = (aiNode *)0x0;
          paVar10 = (aiNode *)std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size(&this->_nodes),
          node < paVar10; node = (aiNode *)((long)&(node->mName).length + 1)) {
        ppaVar11 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::operator[]
                             (&this->_nodes,(size_type)node);
        paVar2 = *ppaVar11;
        for (mesh = (aiMesh *)0x0; mesh < (aiMesh *)(ulong)paVar2->mNumMeshes;
            mesh = (aiMesh *)((long)&mesh->mPrimitiveTypes + 1)) {
          this_01 = std::
                    vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                    ::operator[](&this->_meshes,(ulong)paVar2->mMeshes[(long)mesh]);
          paVar12 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::get(this_01);
          uVar8 = paVar12->mNumFaces * 3;
          paVar12->mNumVertices = uVar8;
          uVar13 = (ulong)(int)uVar8;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar13;
          uVar14 = SUB168(auVar3 * ZEXT816(0xc),0);
          if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
            uVar14 = 0xffffffffffffffff;
          }
          mn = (aiVector3D *)operator_new__(uVar14);
          if (uVar13 != 0) {
            local_328 = mn;
            do {
              aiVector3t<float>::aiVector3t(local_328);
              local_328 = local_328 + 1;
            } while (local_328 != mn + uVar13);
          }
          paVar12->mVertices = mn;
          mc = (aiVector3D *)0x0;
          face = (aiFace *)0x0;
          if ((this->_vflags & 1U) != 0) {
            uVar13 = (ulong)(int)uVar8;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = uVar13;
            uVar14 = SUB168(auVar4 * ZEXT816(0xc),0);
            if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
              uVar14 = 0xffffffffffffffff;
            }
            mc = (aiVector3D *)operator_new__(uVar14);
            if (uVar13 != 0) {
              local_350 = mc;
              do {
                aiVector3t<float>::aiVector3t(local_350);
                local_350 = local_350 + 1;
              } while (local_350 != mc + uVar13);
            }
            paVar12->mNormals = mc;
          }
          if (this->_tcsets != 0) {
            uVar13 = (ulong)(int)uVar8;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = uVar13;
            uVar14 = SUB168(auVar5 * ZEXT816(0xc),0);
            if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
              uVar14 = 0xffffffffffffffff;
            }
            face = (aiFace *)operator_new__(uVar14);
            if (uVar13 != 0) {
              local_378 = face;
              do {
                aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_378);
                local_378 = (aiFace *)((long)&local_378->mIndices + 4);
              } while (local_378 != (aiFace *)(&face->mNumIndices + uVar13 * 3));
            }
            paVar12->mTextureCoords[0] = (aiVector3D *)face;
          }
          vweights.
          super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar12->mFaces;
          sVar9 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size(&this->_nodes);
          std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>::allocator
                    ((allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_> *)
                     ((long)&j_1 + 3));
          std::
          vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ::vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                    *)&i_1,sVar9,
                   (allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_> *)
                   ((long)&j_1 + 3));
          std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>::~allocator
                    ((allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_> *)
                     ((long)&j_1 + 3));
          for (local_1a0 = 0; local_1a0 < (int)uVar8; local_1a0 = local_1a0 + 3) {
            for (v._4_4_ = 0; v._4_4_ < 3; v._4_4_ = v._4_4_ + 1) {
              pvVar15 = std::
                        vector<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                        ::operator[](&this->_vertices,
                                     (ulong)(&(((vweights.
                                                 super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->
                                               super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                               )._M_impl.super__Vector_impl_data._M_finish)->
                                              mVertexId)[v._4_4_]);
              fVar1 = (pvVar15->vertex).y;
              mn->x = (pvVar15->vertex).x;
              mn->y = fVar1;
              mn->z = (pvVar15->vertex).z;
              if (mc != (aiVector3D *)0x0) {
                fVar1 = (pvVar15->normal).y;
                mc->x = (pvVar15->normal).x;
                mc->y = fVar1;
                mc->z = (pvVar15->normal).z;
                mc = mc + 1;
              }
              if (face != (aiFace *)0x0) {
                fVar1 = (pvVar15->texcoords).y;
                face->mNumIndices = (uint)(pvVar15->texcoords).x;
                *(float *)&face->field_0x4 = fVar1;
                *(float *)&face->mIndices = (pvVar15->texcoords).z;
                face = (aiFace *)((long)&face->mIndices + 4);
              }
              (&(((vweights.
                   super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                 super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
                 super__Vector_impl_data._M_finish)->mVertexId)[v._4_4_] = local_1a0 + v._4_4_;
              for (weight = 0.0;
                  ((int)weight < 4 &&
                  ((pvVar15->weights[(int)weight] != 0.0 || (NAN(pvVar15->weights[(int)weight])))));
                  weight = (float)((int)weight + 1)) {
                fVar1 = pvVar15->weights[(int)weight];
                this_02 = std::
                          vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                          ::operator[]((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                        *)&i_1,(long)(int)(uint)pvVar15->bones[(int)weight]);
                aiVertexWeight::aiVertexWeight
                          ((aiVertexWeight *)
                           ((long)&bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                           local_1a0 + v._4_4_,fVar1);
                std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back
                          (this_02,(value_type *)
                                   ((long)&bones.
                                           super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
              }
              mn = mn + 1;
            }
            vweights.
            super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)&((vweights.
                             super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                           super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          std::vector<aiBone_*,_std::allocator<aiBone_*>_>::vector
                    ((vector<aiBone_*,_std::allocator<aiBone_*>_> *)&i_2);
          for (weights = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)0x0;
              pvVar6 = weights,
              pvVar16 = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                        std::
                        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                        ::size((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                *)&i_1), pvVar6 < pvVar16;
              weights = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                        ((long)&(weights->
                                super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)
                                ._M_impl.super__Vector_impl_data._M_start + 1)) {
            bone_1 = (aiBone *)
                     std::
                     vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                     ::operator[]((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                   *)&i_1,(size_type)weights);
            sVar9 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size
                              ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)bone_1);
            if (sVar9 != 0) {
              paVar10 = (aiNode *)operator_new(0x450);
              aiBone::aiBone((aiBone *)paVar10);
              bnode = paVar10;
              std::vector<aiBone_*,_std::allocator<aiBone_*>_>::push_back
                        ((vector<aiBone_*,_std::allocator<aiBone_*>_> *)&i_2,(value_type *)&bnode);
              ppaVar11 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::operator[]
                                   (&this->_nodes,(size_type)weights);
              mat._56_8_ = *ppaVar11;
              aiString::operator=(&bnode->mName,(aiString *)mat._56_8_);
              sVar9 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size
                                ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)bone_1);
              (bnode->mTransformation).a1 = (float)sVar9;
              paVar17 = to_array<aiVertexWeight>
                                  (this,(vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                                        bone_1);
              *(aiVertexWeight **)&(bnode->mTransformation).a2 = paVar17;
              memcpy(local_240,(void *)(mat._56_8_ + 0x404),0x40);
              while (*(long *)(mat._56_8_ + 0x448) != 0) {
                mat._56_8_ = *(long *)(mat._56_8_ + 0x448);
                aiMatrix4x4t<float>::operator*
                          (&local_280,(aiMatrix4x4t<float> *)(mat._56_8_ + 0x404),
                           (aiMatrix4x4t<float> *)local_240);
                memcpy(local_240,&local_280,0x40);
              }
              __src = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_240);
              memcpy(&(bnode->mTransformation).a4,__src,0x40);
            }
          }
          sVar9 = std::vector<aiBone_*,_std::allocator<aiBone_*>_>::size
                            ((vector<aiBone_*,_std::allocator<aiBone_*>_> *)&i_2);
          paVar12->mNumBones = (uint)sVar9;
          ppaVar18 = to_array<aiBone*>(this,(vector<aiBone_*,_std::allocator<aiBone_*>_> *)&i_2);
          paVar12->mBones = ppaVar18;
          std::vector<aiBone_*,_std::allocator<aiBone_*>_>::~vector
                    ((vector<aiBone_*,_std::allocator<aiBone_*>_> *)&i_2);
          std::
          vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ::~vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                     *)&i_1);
        }
      }
      ppaVar11 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::operator[](&this->_nodes,0);
      *(value_type *)(t.field_2._8_8_ + 8) = *ppaVar11;
      std::vector<aiNode_*,_std::allocator<aiNode_*>_>::clear(&this->_nodes);
      sVar9 = std::
              vector<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
              ::size(&this->_materials);
      if (sVar9 == 0) {
        this_03 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(this_03);
        std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>::
        unique_ptr<std::default_delete<aiMaterial>,void>
                  ((unique_ptr<aiMaterial,std::default_delete<aiMaterial>> *)&anim,this_03);
        std::
        vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
        ::emplace_back<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>
                  ((vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
                    *)&this->_materials,
                   (unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)&anim);
        std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr
                  ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)&anim);
      }
      sVar9 = std::
              vector<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
              ::size(&this->_materials);
      *(int *)(t.field_2._8_8_ + 0x20) = (int)sVar9;
      ppaVar19 = unique_to_array<aiMaterial>(&this->_materials);
      *(aiMaterial ***)(t.field_2._8_8_ + 0x28) = ppaVar19;
      sVar9 = std::
              vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
              ::size(&this->_meshes);
      *(int *)(t.field_2._8_8_ + 0x10) = (int)sVar9;
      ppaVar20 = unique_to_array<aiMesh>(&this->_meshes);
      *(aiMesh ***)(t.field_2._8_8_ + 0x18) = ppaVar20;
      sVar9 = std::
              vector<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
              ::size(&this->_animations);
      if ((sVar9 == 1) &&
         (sVar9 = std::
                  vector<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
                  ::size(&this->_nodeAnims), sVar9 != 0)) {
        this_04 = std::
                  vector<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
                  ::back(&this->_animations);
        paVar21 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::get(this_04);
        sVar9 = std::
                vector<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
                ::size(&this->_nodeAnims);
        paVar21->mNumChannels = (uint)sVar9;
        ppaVar22 = unique_to_array<aiNodeAnim>(&this->_nodeAnims);
        paVar21->mChannels = ppaVar22;
        sVar9 = std::
                vector<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
                ::size(&this->_animations);
        *(int *)(t.field_2._8_8_ + 0x30) = (int)sVar9;
        ppaVar23 = unique_to_array<aiAnimation>(&this->_animations);
        *(aiAnimation ***)(t.field_2._8_8_ + 0x38) = ppaVar23;
      }
      MakeLeftHandedProcess::MakeLeftHandedProcess
                ((MakeLeftHandedProcess *)&flip.super_BaseProcess.progress);
      MakeLeftHandedProcess::Execute
                ((MakeLeftHandedProcess *)&flip.super_BaseProcess.progress,
                 (aiScene *)t.field_2._8_8_);
      FlipWindingOrderProcess::FlipWindingOrderProcess((FlipWindingOrderProcess *)local_2c0);
      FlipWindingOrderProcess::Execute
                ((FlipWindingOrderProcess *)local_2c0,(aiScene *)t.field_2._8_8_);
      FlipWindingOrderProcess::~FlipWindingOrderProcess((FlipWindingOrderProcess *)local_2c0);
      MakeLeftHandedProcess::~MakeLeftHandedProcess
                ((MakeLeftHandedProcess *)&flip.super_BaseProcess.progress);
      std::__cxx11::string::~string((string *)local_38);
      return;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"No meshes",(allocator<char> *)((long)&i + 7));
    Fail(this,&local_130);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"No nodes",&local_109);
  Fail(this,&local_108);
}

Assistant:

void B3DImporter::ReadBB3D( aiScene *scene ){

    _textures.clear();

    _materials.clear();

    _vertices.clear();

    _meshes.clear();

    DeleteAllBarePointers(_nodes);
    _nodes.clear();

    _nodeAnims.clear();

    _animations.clear();

    string t=ReadChunk();
    if( t=="BB3D" ){
        int version=ReadInt();

        if (!DefaultLogger::isNullLogger()) {
            char dmp[128];
            ai_snprintf(dmp, 128, "B3D file format version: %i",version);
            ASSIMP_LOG_INFO(dmp);
        }

        while( ChunkSize() ){
            string t=ReadChunk();
            if( t=="TEXS" ){
                ReadTEXS();
            }else if( t=="BRUS" ){
                ReadBRUS();
            }else if( t=="NODE" ){
                ReadNODE( 0 );
            }
            ExitChunk();
        }
    }
    ExitChunk();

    if( !_nodes.size() ) Fail( "No nodes" );

    if( !_meshes.size() ) Fail( "No meshes" );

    //Fix nodes/meshes/bones
    for(size_t i=0;i<_nodes.size();++i ){
        aiNode *node=_nodes[i];

        for( size_t j=0;j<node->mNumMeshes;++j ){
            aiMesh *mesh = _meshes[node->mMeshes[j]].get();

            int n_tris=mesh->mNumFaces;
            int n_verts=mesh->mNumVertices=n_tris * 3;

            aiVector3D *mv=mesh->mVertices=new aiVector3D[ n_verts ],*mn=0,*mc=0;
            if( _vflags & 1 ) mn=mesh->mNormals=new aiVector3D[ n_verts ];
            if( _tcsets ) mc=mesh->mTextureCoords[0]=new aiVector3D[ n_verts ];

            aiFace *face=mesh->mFaces;

            vector< vector<aiVertexWeight> > vweights( _nodes.size() );

            for( int i=0;i<n_verts;i+=3 ){
                for( int j=0;j<3;++j ){
                    Vertex &v=_vertices[face->mIndices[j]];

                    *mv++=v.vertex;
                    if( mn ) *mn++=v.normal;
                    if( mc ) *mc++=v.texcoords;

                    face->mIndices[j]=i+j;

                    for( int k=0;k<4;++k ){
                        if( !v.weights[k] ) break;

                        int bone=v.bones[k];
                        float weight=v.weights[k];

                        vweights[bone].push_back( aiVertexWeight(i+j,weight) );
                    }
                }
                ++face;
            }

            vector<aiBone*> bones;
            for(size_t i=0;i<vweights.size();++i ){
                vector<aiVertexWeight> &weights=vweights[i];
                if( !weights.size() ) continue;

                aiBone *bone=new aiBone;
                bones.push_back( bone );

                aiNode *bnode=_nodes[i];

                bone->mName=bnode->mName;
                bone->mNumWeights= static_cast<unsigned int>(weights.size());
                bone->mWeights=to_array( weights );

                aiMatrix4x4 mat=bnode->mTransformation;
                while( bnode->mParent ){
                    bnode=bnode->mParent;
                    mat=bnode->mTransformation * mat;
                }
                bone->mOffsetMatrix=mat.Inverse();
            }
            mesh->mNumBones= static_cast<unsigned int>(bones.size());
            mesh->mBones=to_array( bones );
        }
    }

    //nodes
    scene->mRootNode=_nodes[0];
    _nodes.clear();  // node ownership now belongs to scene

    //material
    if( !_materials.size() ){
        _materials.emplace_back( std::unique_ptr<aiMaterial>(new aiMaterial) );
    }
    scene->mNumMaterials= static_cast<unsigned int>(_materials.size());
    scene->mMaterials = unique_to_array( _materials );

    //meshes
    scene->mNumMeshes= static_cast<unsigned int>(_meshes.size());
    scene->mMeshes = unique_to_array( _meshes );

    //animations
    if( _animations.size()==1 && _nodeAnims.size() ){

        aiAnimation *anim = _animations.back().get();
        anim->mNumChannels=static_cast<unsigned int>(_nodeAnims.size());
        anim->mChannels = unique_to_array( _nodeAnims );

        scene->mNumAnimations=static_cast<unsigned int>(_animations.size());
        scene->mAnimations=unique_to_array( _animations );
    }

    // convert to RH
    MakeLeftHandedProcess makeleft;
    makeleft.Execute( scene );

    FlipWindingOrderProcess flip;
    flip.Execute( scene );
}